

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::handle_file_request(Server *this,Request *req,Response *res,bool head)

{
  pointer pMVar1;
  size_t in_length;
  bool bVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  __node_base *p_Var6;
  pointer pMVar7;
  uint local_1d0;
  shared_ptr<httplib::detail::mmap> mm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  __shared_ptr<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  _Any_data local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  ContentProvider local_108;
  string sub_path;
  FileStat stat;
  
  pMVar1 = (this->base_dirs_).
           super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1d0 = (uint)&this->file_request_handler_;
  for (pMVar7 = (this->base_dirs_).
                super__Vector_base<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar7 != pMVar1; pMVar7 = pMVar7 + 1) {
    iVar4 = std::__cxx11::string::compare
                      ((ulong)&req->path,0,(string *)(pMVar7->mount_point)._M_string_length);
    if (iVar4 == 0) {
      std::__cxx11::string::substr((ulong)&stat,(ulong)&req->path);
      std::operator+(&sub_path,"/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stat);
      std::__cxx11::string::~string((string *)&stat);
      bVar3 = detail::is_valid_path(&sub_path);
      bVar2 = true;
      if (bVar3) {
        std::operator+(&path,&pMVar7->base_dir,&sub_path);
        if (path._M_dataplus._M_p[path._M_string_length - 1] == '/') {
          std::__cxx11::string::append((char *)&path);
        }
        detail::FileStat::FileStat(&stat,&path);
        if ((stat.st_.st_mode & 0xf000) == 0x4000 && -1 < stat.ret_) {
          std::operator+(&local_148,&sub_path,"/");
          Response::set_redirect(res,&local_148,0x12d);
          std::__cxx11::string::~string((string *)&local_148);
          local_1d0 = 1;
LAB_00168e55:
          bVar2 = false;
        }
        else {
          bVar2 = true;
          if ((stat.st_.st_mode & 0xf000) == 0x8000 && -1 < stat.ret_) {
            p_Var6 = &(pMVar7->headers)._M_h._M_before_begin;
            while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
              Response::set_header(res,(string *)(p_Var6 + 1),(string *)(p_Var6 + 5));
            }
            local_148._M_dataplus._M_p = path._M_dataplus._M_p;
            std::make_shared<httplib::detail::mmap,char_const*>((char **)&mm);
            bVar5 = (mm.super___shared_ptr<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->addr_ != (void *)0x0 |
                    (mm.super___shared_ptr<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->is_open_empty_file;
            local_1d0 = (uint)bVar5;
            if (bVar5 != 0) {
              in_length = (mm.super___shared_ptr<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->size_;
              detail::find_content_type
                        (&local_148,&path,&this->file_extension_and_mimetype_map_,
                         &this->default_file_mimetype_);
              detail::std::__shared_ptr<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr(&local_158,
                           &mm.super___shared_ptr<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2>
                          );
              std::function<bool(unsigned_long,unsigned_long,httplib::DataSink&)>::
              function<httplib::Server::handle_file_request(httplib::Request_const&,httplib::Response&,bool)::_lambda(unsigned_long,unsigned_long,httplib::DataSink&)_1_,void>
                        ((function<bool(unsigned_long,unsigned_long,httplib::DataSink&)> *)
                         &local_108,(anon_class_16_1_3fcf665e *)&local_158);
              local_118 = 0;
              uStack_110 = 0;
              local_128._M_unused._M_object = (void *)0x0;
              local_128._8_8_ = 0;
              Response::set_content_provider
                        (res,in_length,&local_148,&local_108,
                         (ContentProviderResourceReleaser *)&local_128);
              detail::std::_Function_base::~_Function_base((_Function_base *)&local_128);
              detail::std::_Function_base::~_Function_base(&local_108.super__Function_base);
              detail::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_158._M_refcount);
              std::__cxx11::string::~string((string *)&local_148);
              if ((!head) &&
                 ((this->file_request_handler_).super__Function_base._M_manager !=
                  (_Manager_type)0x0)) {
                detail::std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::
                operator()(&this->file_request_handler_,req,res);
              }
            }
            detail::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&mm.super___shared_ptr<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            goto LAB_00168e55;
          }
        }
        std::__cxx11::string::~string((string *)&path);
      }
      std::__cxx11::string::~string((string *)&sub_path);
      if (!bVar2) goto LAB_00168e8a;
    }
  }
  local_1d0._0_1_ = 0;
LAB_00168e8a:
  return (bool)((byte)local_1d0 & 1);
}

Assistant:

inline bool Server::handle_file_request(const Request &req, Response &res,
                                        bool head) {
  for (const auto &entry : base_dirs_) {
    // Prefix match
    if (!req.path.compare(0, entry.mount_point.size(), entry.mount_point)) {
      std::string sub_path = "/" + req.path.substr(entry.mount_point.size());
      if (detail::is_valid_path(sub_path)) {
        auto path = entry.base_dir + sub_path;
        if (path.back() == '/') { path += "index.html"; }

        detail::FileStat stat(path);

        if (stat.is_dir()) {
          res.set_redirect(sub_path + "/", StatusCode::MovedPermanently_301);
          return true;
        }

        if (stat.is_file()) {
          for (const auto &kv : entry.headers) {
            res.set_header(kv.first, kv.second);
          }

          auto mm = std::make_shared<detail::mmap>(path.c_str());
          if (!mm->is_open()) { return false; }

          res.set_content_provider(
              mm->size(),
              detail::find_content_type(path, file_extension_and_mimetype_map_,
                                        default_file_mimetype_),
              [mm](size_t offset, size_t length, DataSink &sink) -> bool {
                sink.write(mm->data() + offset, length);
                return true;
              });

          if (!head && file_request_handler_) {
            file_request_handler_(req, res);
          }

          return true;
        }
      }
    }
  }
  return false;
}